

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.cpp
# Opt level: O1

void __thiscall chrono::ChLink::ArchiveIN(ChLink *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  undefined ***local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLink>(marchive);
  ChLinkBase::ArchiveIN(&this->super_ChLinkBase,marchive);
  local_38 = &this->react_force;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "react_force";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->react_torque;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "react_torque";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChLink::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLink>();

    // deserialize parent class
    ChLinkBase::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(react_force);
    marchive >> CHNVP(react_torque);
}